

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.cpp
# Opt level: O3

void __thiscall embree::Points::commit(Points *this)

{
  BufferView<embree::Vec3fx> *pBVar1;
  size_t sVar2;
  BufferView<embree::Vec3fa> *pBVar3;
  Buffer *pBVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint uVar11;
  int iVar12;
  size_t sVar13;
  bool bVar14;
  undefined3 uVar15;
  undefined8 *puVar16;
  ulong uVar17;
  long lVar18;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  uVar17 = (ulong)(this->super_Geometry).numTimeSteps;
  if (uVar17 != 0) {
    pBVar1 = (this->vertices).items;
    lVar18 = 0;
    do {
      if (*(int *)((long)&(pBVar1->super_RawBufferView).stride + lVar18) !=
          (int)(pBVar1->super_RawBufferView).stride) {
        puVar16 = (undefined8 *)__cxa_allocate_exception(0x30);
        local_38 = local_28;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,
                   "stride of vertex buffers have to be identical for each time step","");
        *puVar16 = &PTR__rtcore_error_02184a18;
        *(undefined4 *)(puVar16 + 1) = 3;
        puVar16[2] = puVar16 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar16 + 2),local_38,local_38 + local_30);
        __cxa_throw(puVar16,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      lVar18 = lVar18 + 0x38;
    } while (uVar17 * 0x38 - lVar18 != 0);
  }
  sVar2 = (this->normals).size_active;
  if (sVar2 != 0) {
    pBVar3 = (this->normals).items;
    lVar18 = 0;
    do {
      if (*(int *)((long)&(pBVar3->super_RawBufferView).stride + lVar18) !=
          (int)(pBVar3->super_RawBufferView).stride) {
        puVar16 = (undefined8 *)__cxa_allocate_exception(0x30);
        local_38 = local_28;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,
                   "stride of normal buffers have to be identical for each time step","");
        *puVar16 = &PTR__rtcore_error_02184a18;
        *(undefined4 *)(puVar16 + 1) = 3;
        puVar16[2] = puVar16 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar16 + 2),local_38,local_38 + local_30);
        __cxa_throw(puVar16,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      lVar18 = lVar18 + 0x38;
    } while (sVar2 * 0x38 - lVar18 != 0);
  }
  pBVar1 = (this->vertices).items;
  uVar5 = *(undefined4 *)&(pBVar1->super_RawBufferView).ptr_ofs;
  uVar6 = *(undefined4 *)((long)&(pBVar1->super_RawBufferView).ptr_ofs + 4);
  uVar7 = *(undefined4 *)&(pBVar1->super_RawBufferView).dptr_ofs;
  uVar8 = *(undefined4 *)((long)&(pBVar1->super_RawBufferView).dptr_ofs + 4);
  sVar2 = (pBVar1->super_RawBufferView).stride;
  uVar9 = *(undefined4 *)((long)&(pBVar1->super_RawBufferView).stride + 4);
  sVar13 = (pBVar1->super_RawBufferView).num;
  uVar10 = *(undefined4 *)((long)&(pBVar1->super_RawBufferView).num + 4);
  uVar11 = (pBVar1->super_RawBufferView).modCounter;
  bVar14 = (pBVar1->super_RawBufferView).modified;
  uVar15 = *(undefined3 *)&(pBVar1->super_RawBufferView).field_0x29;
  iVar12 = (pBVar1->super_RawBufferView).userData;
  *(RTCFormat *)&this->field_0x78 = (pBVar1->super_RawBufferView).format;
  *(uint *)&this->field_0x7c = uVar11;
  this->field_0x80 = bVar14;
  *(undefined3 *)&this->field_0x81 = uVar15;
  *(int *)&this->field_0x84 = iVar12;
  *(int *)&this->field_0x68 = (int)sVar2;
  *(undefined4 *)&this->field_0x6c = uVar9;
  *(int *)&this->field_0x70 = (int)sVar13;
  *(undefined4 *)&this->field_0x74 = uVar10;
  *(undefined4 *)&(this->super_Geometry).field_0x58 = uVar5;
  *(undefined4 *)&(this->super_Geometry).field_0x5c = uVar6;
  *(undefined4 *)&this->field_0x60 = uVar7;
  *(undefined4 *)&this->field_0x64 = uVar8;
  pBVar4 = (pBVar1->super_RawBufferView).buffer.ptr;
  if (pBVar4 != (Buffer *)0x0) {
    (*(pBVar4->super_RefCount)._vptr_RefCount[2])();
  }
  if (*(long **)&this->field_0x88 != (long *)0x0) {
    (**(code **)(**(long **)&this->field_0x88 + 0x18))();
  }
  *(Buffer **)&this->field_0x88 = (pBVar1->super_RawBufferView).buffer.ptr;
  if (*(char *)&(this->super_Geometry).field_8 == '\x1b') {
    pBVar3 = (this->normals).items;
    uVar5 = *(undefined4 *)&(pBVar3->super_RawBufferView).ptr_ofs;
    uVar6 = *(undefined4 *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + 4);
    uVar7 = *(undefined4 *)&(pBVar3->super_RawBufferView).dptr_ofs;
    uVar8 = *(undefined4 *)((long)&(pBVar3->super_RawBufferView).dptr_ofs + 4);
    sVar2 = (pBVar3->super_RawBufferView).stride;
    uVar9 = *(undefined4 *)((long)&(pBVar3->super_RawBufferView).stride + 4);
    sVar13 = (pBVar3->super_RawBufferView).num;
    uVar10 = *(undefined4 *)((long)&(pBVar3->super_RawBufferView).num + 4);
    uVar11 = (pBVar3->super_RawBufferView).modCounter;
    bVar14 = (pBVar3->super_RawBufferView).modified;
    uVar15 = *(undefined3 *)&(pBVar3->super_RawBufferView).field_0x29;
    iVar12 = (pBVar3->super_RawBufferView).userData;
    (this->normals0).super_RawBufferView.format = (pBVar3->super_RawBufferView).format;
    (this->normals0).super_RawBufferView.modCounter = uVar11;
    (this->normals0).super_RawBufferView.modified = bVar14;
    *(undefined3 *)&(this->normals0).super_RawBufferView.field_0x29 = uVar15;
    (this->normals0).super_RawBufferView.userData = iVar12;
    *(int *)&(this->normals0).super_RawBufferView.stride = (int)sVar2;
    *(undefined4 *)((long)&(this->normals0).super_RawBufferView.stride + 4) = uVar9;
    *(int *)&(this->normals0).super_RawBufferView.num = (int)sVar13;
    *(undefined4 *)((long)&(this->normals0).super_RawBufferView.num + 4) = uVar10;
    *(undefined4 *)&(this->normals0).super_RawBufferView.ptr_ofs = uVar5;
    *(undefined4 *)((long)&(this->normals0).super_RawBufferView.ptr_ofs + 4) = uVar6;
    *(undefined4 *)&(this->normals0).super_RawBufferView.dptr_ofs = uVar7;
    *(undefined4 *)((long)&(this->normals0).super_RawBufferView.dptr_ofs + 4) = uVar8;
    pBVar4 = (pBVar3->super_RawBufferView).buffer.ptr;
    if (pBVar4 != (Buffer *)0x0) {
      (*(pBVar4->super_RefCount)._vptr_RefCount[2])();
    }
    pBVar4 = (this->normals0).super_RawBufferView.buffer.ptr;
    if (pBVar4 != (Buffer *)0x0) {
      (*(pBVar4->super_RefCount)._vptr_RefCount[3])();
    }
    (this->normals0).super_RawBufferView.buffer.ptr = (pBVar3->super_RawBufferView).buffer.ptr;
  }
  Geometry::commit(&this->super_Geometry);
  return;
}

Assistant:

void Points::commit()
  {
    /* verify that stride of all time steps are identical */
    for (unsigned int t = 0; t < numTimeSteps; t++) {
      if (vertices[t].getStride() != vertices[0].getStride())
        throw_RTCError(RTC_ERROR_INVALID_OPERATION, "stride of vertex buffers have to be identical for each time step");
      vertices[t].buffer->commitIfNeeded();
    }
    for (auto& buffer : normals) {
      if (buffer.getStride() != normals[0].getStride())
        throw_RTCError(RTC_ERROR_INVALID_OPERATION, "stride of normal buffers have to be identical for each time step");
      buffer.buffer->commitIfNeeded();
    }
    vertices0 = vertices[0];
    if (getType() == GTY_ORIENTED_DISC_POINT)
      normals0 = normals[0];

    Geometry::commit();
  }